

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O0

void avalues(double *w,int N,int p,int q,double *phi,double *theta,int s,int ps,int qs,double *phis,
            double *thetas,int tval,double *a)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  double dVar3;
  double *alpha2;
  double *alpha;
  double *w2;
  double *e;
  double temp;
  int iter;
  int newl;
  int t2;
  int t;
  int i;
  int k;
  double *theta_local;
  double *phi_local;
  int q_local;
  int p_local;
  int N_local;
  double *w_local;
  
  __ptr = malloc((long)N << 3);
  __ptr_00 = malloc((long)tval << 3);
  t = q;
  if (q < p) {
    t = p;
  }
  if (t < ps) {
    t = ps;
  }
  if (t < qs) {
    t = qs;
  }
  __ptr_01 = malloc((long)(tval + N + t) << 3);
  __ptr_02 = malloc((long)(tval + N + t) << 3);
  for (t2 = 0; t2 < N; t2 = t2 + 1) {
    *(undefined8 *)((long)__ptr + (long)t2 * 8) = 0;
  }
  for (t2 = 0; t2 < N + tval + t; t2 = t2 + 1) {
    *(undefined8 *)((long)__ptr_01 + (long)t2 * 8) = 0;
  }
  for (t2 = 0; t2 < N + tval + -1; t2 = t2 + 1) {
    a[t2] = 0.0;
  }
  for (t2 = 0; t2 < tval; t2 = t2 + 1) {
    *(undefined8 *)((long)__ptr_00 + (long)t2 * 8) = 0;
  }
  t2 = N - t;
  while (t2 = t2 + -1, -1 < t2) {
    e = (double *)0x0;
    for (newl = 0; newl < p; newl = newl + 1) {
      e = (double *)(-phi[newl] * w[t2 + newl + 1] + (double)e);
    }
    for (iter = 0; iter < q; iter = iter + 1) {
      e = (double *)(theta[iter] * *(double *)((long)__ptr + (long)(iter + t2 + 1) * 8) + (double)e)
      ;
    }
    *(double *)((long)__ptr + (long)t2 * 8) = w[t2] + (double)e;
  }
  for (t2 = 0; t2 < tval; t2 = t2 + 1) {
    e = (double *)0x0;
    for (newl = 0; newl < p; newl = newl + 1) {
      if (newl - t2 < 0) {
        dVar3 = -phi[newl] * *(double *)((long)__ptr_00 + (long)((t2 - newl) + -1) * 8);
      }
      else {
        dVar3 = -phi[newl] * w[newl - t2];
      }
      e = (double *)(dVar3 + (double)e);
    }
    for (iter = 0; iter < q; iter = iter + 1) {
      if (-1 < iter - t2) {
        e = (double *)(theta[iter] * *(double *)((long)__ptr + (long)(iter - t2) * 8) + (double)e);
      }
    }
    *(ulong *)((long)__ptr_00 + (long)t2 * 8) = (ulong)e ^ 0x8000000000000000;
  }
  iVar2 = N + tval;
  for (temp._0_4_ = t; temp._0_4_ < iVar2 + t; temp._0_4_ = temp._0_4_ + 1) {
    e = (double *)0x0;
    for (newl = 0; newl < p; newl = newl + 1) {
      if ((temp._0_4_ - newl) + -1 < tval + t) {
        if (((temp._0_4_ - newl) + -1 < tval + t) && (t <= (temp._0_4_ - newl) + -1)) {
          e = (double *)
              (-phi[newl] * *(double *)((long)__ptr_00 + (long)((t - temp._0_4_) + tval + newl) * 8)
              + (double)e);
        }
      }
      else {
        e = (double *)(-phi[newl] * w[(((temp._0_4_ - newl) + -1) - tval) - t] + (double)e);
      }
    }
    for (iter = 0; iter < q; iter = iter + 1) {
      if (t <= (temp._0_4_ - iter) + -1) {
        e = (double *)
            (theta[iter] * *(double *)((long)__ptr_01 + (long)((temp._0_4_ - iter) + -1) * 8) +
            (double)e);
      }
    }
    if (temp._0_4_ < tval + t) {
      if (t <= temp._0_4_) {
        *(double *)((long)__ptr_01 + (long)temp._0_4_ * 8) =
             *(double *)((long)__ptr_00 + (long)((t - temp._0_4_) + tval + -1) * 8) + (double)e;
      }
    }
    else {
      *(double *)((long)__ptr_01 + (long)temp._0_4_ * 8) = w[(temp._0_4_ - tval) - t] + (double)e;
    }
  }
  for (t2 = 0; t2 < iVar2 + t; t2 = t2 + 1) {
    *(undefined8 *)((long)__ptr_02 + (long)temp._0_4_ * 8) = 0;
  }
  for (temp._0_4_ = t; iVar1 = t, temp._0_4_ < iVar2 + t; temp._0_4_ = temp._0_4_ + 1) {
    e = (double *)0x0;
    for (newl = 0; newl < p; newl = newl + 1) {
      e = (double *)
          (-phis[newl] * *(double *)((long)__ptr_01 + (long)(temp._0_4_ - (newl + 1) * s) * 8) +
          (double)e);
    }
    for (iter = 0; iter < q; iter = iter + 1) {
      e = (double *)
          (thetas[iter] * *(double *)((long)__ptr_02 + (long)(temp._0_4_ - (iter + 1) * s) * 8) +
          (double)e);
    }
    *(double *)((long)__ptr_02 + (long)temp._0_4_ * 8) =
         *(double *)((long)__ptr_01 + (long)temp._0_4_ * 8) + (double)e;
  }
  while (temp._0_4_ = iVar1 + 1, temp._0_4_ < iVar2 + t) {
    a[(temp._0_4_ - t) + -1] = *(double *)((long)__ptr_02 + (long)temp._0_4_ * 8);
    iVar1 = temp._0_4_;
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  return;
}

Assistant:

void avalues(double *w,int N,int p, int q, double *phi,double *theta,int s,int ps,int qs,
		double *phis, double *thetas,int tval,double *a) {

	int k,i,t,t2,newl,iter;
	double temp;
	double *e,*w2,*alpha,*alpha2;


	e = (double*) malloc(sizeof(double) * N);
	w2 = (double*) malloc(sizeof(double) * tval);

	if (p > q) {
		k = p;
	} else {
		k = q;
	}

	if ( k < ps) {
		k = ps;
	}

	if (k < qs) {
		k = qs;
	}

	alpha = (double*) malloc(sizeof(double) * (tval+N+k));
	alpha2 = (double*) malloc(sizeof(double) * (tval+N+k));

	for(i = 0; i < N;++i) {
		e[i] = 0.0;
	}

	for(i = 0; i < N+tval+k;++i) {
		alpha[i] = 0.0;
	}

	for(i = 0; i < N+tval-1;++i) {
		a[i] = 0.0;
	}

	for(i = 0; i < tval;++i) {
		w2[i] = 0.0;
	}

	for(i = N-k-1; i >= 0; --i) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phi[t] * w[i+t+1];
		}

		for ( t2 = 0; t2 < q;++t2) {
			temp = temp + theta[t2] * e[t2+i+1];
		}

		e[i] = w[i] + temp;
	}

	for(i = 0; i < tval;++i) {
		temp = 0.0;
		for(t = 0; t < p;++t) {
			if (t-i < 0) {
				temp = temp - phi[t]*w2[i-t-1];
			} else {
				temp = temp - phi[t]*w[t-i];
			}
			//printf("temp %g \n",temp);

		}

		for(t2 = 0; t2 < q;++t2) {
			if (t2-i >= 0) {
				temp=temp+theta[t2]*e[t2-i];
			}
		}
		w2[i] = -temp;
	}

	newl = N + tval;


	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;
		for (t = 0; t < p;++t) {
			if (iter-t-1 >= tval+k ) {
				temp = temp - phi[t] * w[iter-t-1-tval-k];
			} else if (iter-t-1 < tval+k && iter-t-1 >= k) {
				temp = temp - phi[t] * w2[k-iter+tval+t];
			}
		}

		for (t2 = 0; t2 < q; ++t2) {
			if (iter-t2-1 >= k ) {
				temp = temp + theta[t2] * alpha[iter-t2-1];
			}
		}

		//printf("%g \n",temp);

		if (iter >= tval+k) {
			alpha[iter] = w[iter-tval-k] + temp;
		} else if (iter >= k){
			alpha[iter] = w2[k-iter+tval-1] + temp;
		}
	}
/*
	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha[iter];
	}
*/
	for(i = 0; i < newl+k;++i) {
		alpha2[iter] = 0.0;
	}

	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phis[t] * alpha[iter - (t+1) * s];
		}

		for (t2 = 0; t2 < q; ++t2) {
			temp = temp + thetas[t2] * alpha2[iter-(t2+1)*s];
		}

		alpha2[iter] = alpha[iter] + temp;

	}

	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha2[iter];
	}


	free(e);
	free(w2);
	free(alpha);
	free(alpha2);

}